

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_1::createBasicTests(TestCaseGroup *group)

{
  TestContext *pTVar1;
  TestNode *pTVar2;
  TestCaseGroup *group_local;
  
  pTVar1 = tcu::TestNode::getTestContext(&group->super_TestNode);
  pTVar2 = &createBasicFenceTests(pTVar1)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  pTVar1 = tcu::TestNode::getTestContext(&group->super_TestNode);
  pTVar2 = &createBasicSemaphoreTests(pTVar1)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  pTVar1 = tcu::TestNode::getTestContext(&group->super_TestNode);
  pTVar2 = &createBasicEventTests(pTVar1)->super_TestNode;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  return;
}

Assistant:

void createBasicTests (tcu::TestCaseGroup* group)
{
	group->addChild(createBasicFenceTests	 (group->getTestContext()));
	group->addChild(createBasicSemaphoreTests(group->getTestContext()));
	group->addChild(createBasicEventTests	 (group->getTestContext()));
}